

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O2

SQInteger __thiscall
SQFuncState::PushLocalVariable(SQFuncState *this,SQObject *name,bool assignable)

{
  uint uVar1;
  ulong uVar2;
  SQLocalVarInfo lvi;
  SQLocalVarInfo local_38;
  
  uVar1 = (this->_vlocals)._size;
  local_38._name.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38._name.super_SQObject._type = OT_NULL;
  local_38._name.super_SQObject._flags = '\0';
  local_38._name.super_SQObject._5_3_ = 0;
  local_38._start_op = 0;
  local_38._end_op = 0;
  local_38._pos = 0;
  local_38._assignable = true;
  SQObjectPtr::operator=(&local_38._name,name);
  local_38._start_op = (this->_instructions)._size;
  local_38._pos = (this->_vlocals)._size;
  local_38._assignable = assignable;
  sqvector<SQLocalVarInfo,_unsigned_int>::push_back(&this->_vlocals,&local_38);
  uVar2 = (ulong)(this->_vlocals)._size;
  if ((ulong)this->_stacksize < uVar2) {
    this->_stacksize = uVar2;
  }
  SQObjectPtr::~SQObjectPtr(&local_38._name);
  return (ulong)uVar1;
}

Assistant:

SQInteger SQFuncState::PushLocalVariable(const SQObject &name, bool assignable)
{
    SQInteger pos=_vlocals.size();
    SQLocalVarInfo lvi;
    lvi._name=name;
    lvi._start_op=GetCurrentPos()+1;
    lvi._pos=_vlocals.size();
    lvi._assignable=assignable;
    _vlocals.push_back(lvi);
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize))_stacksize=_vlocals.size();
    return pos;
}